

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcSpfd.c
# Opt level: O1

Vec_Wrd_t * Bdc_SpfdReadFiles6(Vec_Int_t **pvWeights)

{
  Vec_Wrd_t *pVVar1;
  word *__s;
  FILE *pFVar2;
  Vec_Int_t *pVVar3;
  int *__s_00;
  
  pVVar1 = (Vec_Wrd_t *)malloc(0x10);
  *(char **)pVVar1 = Lpk_ComposeSets::Over + 0x40a7;
  __s = (word *)malloc(0x617a9b8);
  pVVar1->pArray = __s;
  pVVar1->nSize = 0xc2f537;
  memset(__s,0,0x617a9b8);
  pFVar2 = fopen("func6v6n_bin.txt","rb");
  fread(__s,8,0xc2f537,pFVar2);
  fclose(pFVar2);
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  *(char **)pVVar3 = Lpk_ComposeSets::Over + 0x40a7;
  __s_00 = (int *)malloc(0x30bd4dc);
  pVVar3->pArray = __s_00;
  pVVar3->nSize = 0xc2f537;
  memset(__s_00,0,0x30bd4dc);
  pFVar2 = fopen("func6v6nW_bin.txt","rb");
  fread(pVVar3->pArray,4,(long)pVVar3->nSize,pFVar2);
  fclose(pFVar2);
  *pvWeights = pVVar3;
  return pVVar1;
}

Assistant:

Vec_Wrd_t * Bdc_SpfdReadFiles6( Vec_Int_t ** pvWeights )
{
    Vec_Int_t * vWeights;
    Vec_Wrd_t * vDivs = Vec_WrdStart( 12776759 );
    FILE * pFile = fopen( "func6v6n_bin.txt", "rb" );
    int RetValue;
    RetValue = fread( Vec_WrdArray(vDivs), sizeof(word), Vec_WrdSize(vDivs), pFile );
    fclose( pFile );

    vWeights = Vec_IntStart( 12776759 );
    pFile = fopen( "func6v6nW_bin.txt", "rb" );
    RetValue = fread( Vec_IntArray(vWeights), sizeof(int), Vec_IntSize(vWeights), pFile );
    fclose( pFile );

    *pvWeights = vWeights;
    return vDivs;
}